

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

bool __thiscall QObject::doSetProperty(QObject *this,char *name,QVariant *lvalue,QVariant *rvalue)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  qsizetype qVar6;
  ssize_t sVar7;
  QMetaObject *in_RCX;
  QMetaObject *__n;
  char *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int idx;
  int id;
  QMetaObject *meta;
  QVariant *value;
  QObjectPrivate *d;
  QMetaProperty p;
  QDynamicPropertyChangeEvent ev;
  QEvent *in_stack_fffffffffffffec8;
  QDynamicPropertyChangeEvent *in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  QObjectPrivate *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  QMetaObject *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  QMetaObject *in_stack_ffffffffffffff08;
  bool local_91;
  QMetaProperty local_90;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_10;
  long local_8;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __n = in_RCX;
  local_10 = in_RSI;
  d_func((QObject *)0x3f7a5e);
  lVar5 = (**(code **)*in_RDI)();
  if ((local_10 == 0) || (lVar5 == 0)) {
    local_91 = false;
  }
  else {
    iVar3 = QMetaObject::indexOfProperty
                      (in_stack_ffffffffffffff08,
                       (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    if (iVar3 < 0) {
      QObjectPrivate::ensureExtraData(in_stack_fffffffffffffee0);
      qVar6 = QListSpecialMethodsBase<QByteArray>::indexOf<char_const*>
                        ((QListSpecialMethodsBase<QByteArray> *)in_stack_fffffffffffffee0,
                         (char **)CONCAT17(in_stack_fffffffffffffedf,
                                           CONCAT16(in_stack_fffffffffffffede,
                                                    in_stack_fffffffffffffed8)),
                         (qsizetype)in_stack_fffffffffffffed0);
      bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffed0);
      if (bVar1) {
        if ((int)qVar6 == -1) {
          QByteArray::QByteArray
                    ((QByteArray *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffef8,(qsizetype)in_stack_fffffffffffffef0);
          QList<QByteArray>::append
                    ((QList<QByteArray> *)in_stack_fffffffffffffed0,
                     (rvalue_ref)in_stack_fffffffffffffec8);
          QByteArray::~QByteArray((QByteArray *)0x3f7bb2);
          if (in_RCX == (QMetaObject *)0x0) {
            QList<QVariant>::append
                      ((QList<QVariant> *)in_stack_fffffffffffffed0,
                       (parameter_type)in_stack_fffffffffffffec8);
          }
          else {
            QList<QVariant>::append
                      ((QList<QVariant> *)in_stack_fffffffffffffed0,
                       (rvalue_ref)in_stack_fffffffffffffec8);
          }
        }
        else {
          in_stack_ffffffffffffff04 = ::QVariant::userType((QVariant *)0x3f7c2c);
          QList<QVariant>::at((QList<QVariant> *)in_stack_fffffffffffffed0,
                              (qsizetype)in_stack_fffffffffffffec8);
          iVar4 = ::QVariant::userType((QVariant *)0x3f7c52);
          if (in_stack_ffffffffffffff04 == iVar4) {
            QList<QVariant>::at((QList<QVariant> *)in_stack_fffffffffffffed0,
                                (qsizetype)in_stack_fffffffffffffec8);
            bVar1 = ::operator==((QVariant *)in_stack_fffffffffffffed0,
                                 (QVariant *)in_stack_fffffffffffffec8);
            in_stack_fffffffffffffef8 = in_RDX;
            if (bVar1) {
              local_91 = false;
              goto LAB_003f7ea2;
            }
          }
          if (in_RCX == (QMetaObject *)0x0) {
            QList<QVariant>::operator[]
                      ((QList<QVariant> *)in_stack_fffffffffffffed0,
                       (qsizetype)in_stack_fffffffffffffec8);
            ::QVariant::operator=
                      ((QVariant *)in_stack_fffffffffffffee0,
                       (QVariant *)
                       CONCAT17(in_stack_fffffffffffffedf,
                                CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
          }
          else {
            QList<QVariant>::operator[]
                      ((QList<QVariant> *)in_stack_fffffffffffffed0,
                       (qsizetype)in_stack_fffffffffffffec8);
            ::QVariant::operator=
                      ((QVariant *)
                       CONCAT17(in_stack_fffffffffffffedf,
                                CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                       (QVariant *)in_stack_fffffffffffffed0);
            in_stack_fffffffffffffef0 = in_RCX;
          }
        }
      }
      else {
        if ((int)qVar6 == -1) {
          local_91 = false;
          goto LAB_003f7ea2;
        }
        QList<QByteArray>::removeAt
                  ((QList<QByteArray> *)in_stack_fffffffffffffed0,
                   (qsizetype)in_stack_fffffffffffffec8);
        QList<QVariant>::removeAt
                  ((QList<QVariant> *)in_stack_fffffffffffffed0,(qsizetype)in_stack_fffffffffffffec8
                  );
      }
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray
                ((QByteArray *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8,(qsizetype)in_stack_fffffffffffffef0);
      QDynamicPropertyChangeEvent::QDynamicPropertyChangeEvent
                (in_stack_fffffffffffffed0,(QByteArray *)in_stack_fffffffffffffec8);
      QByteArray::~QByteArray((QByteArray *)0x3f7d84);
      QCoreApplication::sendEvent((QObject *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      local_91 = false;
      QDynamicPropertyChangeEvent::~QDynamicPropertyChangeEvent(in_stack_fffffffffffffed0);
    }
    else {
      local_90.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_90.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      local_90.menum.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_90.menum.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      QMetaObject::property(in_stack_fffffffffffffef0,iVar4);
      if (in_RCX == (QMetaObject *)0x0) {
        sVar7 = QMetaProperty::write(&local_90,(int)in_RDI,in_RDX,(size_t)__n);
        bVar2 = (byte)sVar7;
      }
      else {
        sVar7 = QMetaProperty::write(&local_90,(int)in_RDI,in_RCX,(size_t)__n);
        bVar2 = (byte)sVar7;
      }
      local_91 = (bool)(bVar2 & 1);
    }
  }
LAB_003f7ea2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_91;
}

Assistant:

bool QObject::doSetProperty(const char *name, const QVariant *lvalue, QVariant *rvalue)
{
    Q_D(QObject);
    const auto &value =*lvalue;
    const QMetaObject *meta = metaObject();
    if (!name || !meta)
        return false;

    int id = meta->indexOfProperty(name);
    if (id < 0) {
        d->ensureExtraData();

        const int idx = d->extraData->propertyNames.indexOf(name);

        if (!value.isValid()) {
            if (idx == -1)
                return false;
            d->extraData->propertyNames.removeAt(idx);
            d->extraData->propertyValues.removeAt(idx);
        } else {
            if (idx == -1) {
                d->extraData->propertyNames.append(name);
                if (rvalue)
                    d->extraData->propertyValues.append(std::move(*rvalue));
                else
                    d->extraData->propertyValues.append(*lvalue);
            } else {
                if (value.userType() == d->extraData->propertyValues.at(idx).userType()
                        && value == d->extraData->propertyValues.at(idx))
                    return false;
                if (rvalue)
                    d->extraData->propertyValues[idx] = std::move(*rvalue);
                else
                    d->extraData->propertyValues[idx] = *lvalue;
            }
        }

        QDynamicPropertyChangeEvent ev(name);
        QCoreApplication::sendEvent(this, &ev);

        return false;
    }
    QMetaProperty p = meta->property(id);
#ifndef QT_NO_DEBUG
    if (!p.isWritable())
        qWarning("%s::setProperty: Property \"%s\" invalid,"
                 " read-only or does not exist", metaObject()->className(), name);
#endif
    return rvalue ? p.write(this, std::move(*rvalue)) : p.write(this, *lvalue);
}